

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5.hpp
# Opt level: O2

void __thiscall trng::yarn5::backward(yarn5 *this)

{
  uint uVar1;
  undefined8 uVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar5 = (this->P).a[4];
  if (iVar5 == 0) {
    iVar5 = (this->P).a[3];
    if (iVar5 == 0) {
      iVar5 = (this->P).a[2];
      if (iVar5 != 0) {
        iVar4 = (this->S).r[1] - (int)(((long)(this->S).r[2] * (long)(this->P).a[0]) % 0x7fffffff);
        iVar6 = iVar4 + 0x7fffffff;
        if (-1 < iVar4) {
          iVar6 = iVar4;
        }
        uVar7 = iVar6 - (int)(((long)(this->S).r[3] * (long)(this->P).a[1]) % 0x7fffffff);
        goto LAB_0010abe3;
      }
      iVar5 = (this->P).a[1];
      if (iVar5 == 0) {
        iVar3 = (this->P).a[0];
        if (iVar3 == 0) {
          iVar5 = 0;
        }
        else {
          iVar5 = (this->S).r[3];
          iVar3 = int_math::modulo_inverse(iVar3,0x7fffffff);
          iVar5 = (int)(((long)iVar3 * (long)iVar5) % 0x7fffffff);
        }
        goto LAB_0010ac72;
      }
      iVar4 = (this->S).r[2] - (int)(((long)(this->S).r[3] * (long)(this->P).a[0]) % 0x7fffffff);
      iVar6 = iVar4 + 0x7fffffff;
      if (-1 < iVar4) {
        iVar6 = iVar4;
      }
      uVar8 = (ulong)iVar6;
    }
    else {
      iVar4 = (this->S).r[0] - (int)(((long)(this->S).r[1] * (long)(this->P).a[0]) % 0x7fffffff);
      iVar6 = iVar4 + 0x7fffffff;
      if (-1 < iVar4) {
        iVar6 = iVar4;
      }
      iVar6 = iVar6 - (int)(((long)(this->S).r[2] * (long)(this->P).a[1]) % 0x7fffffff);
      iVar4 = iVar6 + 0x7fffffff;
      if (-1 < iVar6) {
        iVar4 = iVar6;
      }
      uVar7 = iVar4 - (int)(((long)(this->S).r[3] * (long)(this->P).a[2]) % 0x7fffffff);
      uVar8 = (ulong)(uVar7 + 0x7fffffff);
      if (-1 < (int)uVar7) {
        uVar8 = (ulong)uVar7;
      }
    }
  }
  else {
    iVar4 = (this->S).r[0] - (int)(((long)(this->S).r[1] * (long)(this->P).a[0]) % 0x7fffffff);
    iVar6 = iVar4 + 0x7fffffff;
    if (-1 < iVar4) {
      iVar6 = iVar4;
    }
    iVar6 = iVar6 - (int)(((long)(this->S).r[2] * (long)(this->P).a[1]) % 0x7fffffff);
    iVar4 = iVar6 + 0x7fffffff;
    if (-1 < iVar6) {
      iVar4 = iVar6;
    }
    iVar4 = iVar4 - (int)(((long)(this->S).r[3] * (long)(this->P).a[2]) % 0x7fffffff);
    iVar6 = iVar4 + 0x7fffffff;
    if (-1 < iVar4) {
      iVar6 = iVar4;
    }
    uVar7 = iVar6 - (int)(((long)(this->S).r[4] * (long)(this->P).a[3]) % 0x7fffffff);
LAB_0010abe3:
    uVar1 = uVar7 + 0x7fffffff;
    if (-1 < (int)uVar7) {
      uVar1 = uVar7;
    }
    uVar8 = (ulong)uVar1;
  }
  iVar3 = int_math::modulo_inverse(iVar5,0x7fffffff);
  iVar5 = (int)((long)((long)iVar3 * uVar8) % 0x7fffffff);
LAB_0010ac72:
  uVar2 = *(undefined8 *)((this->S).r + 3);
  *(undefined8 *)(this->S).r = *(undefined8 *)((this->S).r + 1);
  *(undefined8 *)((this->S).r + 2) = uVar2;
  (this->S).r[4] = iVar5;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn5::backward() {
    result_type t;
    if (P.a[4] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[3]) * static_cast<int64_t>(S.r[4])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[4], modulus))) %
          modulus);
    } else if (P.a[3] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[2]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[3], modulus))) %
          modulus);
    } else if (P.a[2] != 0) {
      t = S.r[1];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[2])) % modulus);
      if (t < 0)
        t += modulus;
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[1]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[2], modulus))) %
          modulus);
    } else if (P.a[1] != 0) {
      t = S.r[2];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[3])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[3];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = S.r[2];
    S.r[2] = S.r[3];
    S.r[3] = S.r[4];
    S.r[4] = t;
  }